

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMeshControl::InsertPeriferalMaterialObjects(TPZMHMeshControl *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  TPZMaterial *pTVar5;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *pTVar6;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_> *this_00;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_> *this_01;
  long lVar7;
  ulong uVar8;
  TPZFNMatrix<4,_double> val1;
  double *local_1c8;
  TPZFMatrix<double> local_1a0;
  double local_110 [5];
  TPZFMatrix<double> local_e8;
  double local_58 [5];
  
  pTVar5 = TPZCompMesh::FindMaterial
                     (((this->fCMesh).fRef)->fPointer,
                      (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                      _M_color);
  if (pTVar5 == (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x64a);
  }
  lVar7 = (long)this->fNState;
  local_e8.fElem = local_58;
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01878f70;
  local_e8.fSize = 4;
  local_1c8 = (double *)0x0;
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar7;
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar7;
  local_e8.fGiven = local_e8.fElem;
  TPZVec<int>::TPZVec(&local_e8.fPivot.super_TPZVec<int>,0);
  local_e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_e8.fPivot.super_TPZVec<int>.fStore = local_e8.fPivot.fExtAlloc;
  local_e8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_e8.fWork.fStore = (double *)0x0;
  local_e8.fWork.fNElements = 0;
  local_e8.fWork.fNAlloc = 0;
  if (lVar7 != 0) {
    uVar8 = lVar7 * lVar7;
    if (uVar8 < 5) goto LAB_0139b66c;
    local_1c8 = (double *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
  }
  local_e8.fElem = local_1c8;
LAB_0139b66c:
  local_e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01878c80;
  TPZFMatrix<double>::operator=(&local_e8,0.0);
  iVar1 = this->fNState;
  local_1a0.fElem = local_110;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01878f70;
  local_1a0.fSize = 4;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)iVar1;
  local_1a0.fGiven = local_1a0.fElem;
  TPZVec<int>::TPZVec(&local_1a0.fPivot.super_TPZVec<int>,0);
  local_1a0.fPivot.super_TPZVec<int>.fStore = local_1a0.fPivot.fExtAlloc;
  local_1a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1a0.fWork.fStore = (double *)0x0;
  local_1a0.fWork.fNElements = 0;
  local_1a0.fWork.fNAlloc = 0;
  if (iVar1 == 0) {
    local_1a0.fElem = (double *)0x0;
  }
  else if (4 < iVar1) {
    local_1a0.fElem = (double *)operator_new__((long)iVar1 << 3);
  }
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01878c80;
  TPZFMatrix<double>::operator=(&local_1a0,0.0);
  pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fSkeletonMatId);
  if (pTVar5 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x651);
  }
  pTVar6 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)operator_new(0x50);
  iVar1 = this->fSkeletonMatId;
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZSavable_018c8710;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase(pTVar6,&PTR_PTR_018c7c38,iVar1);
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZNullMaterial_018c7a58;
  (pTVar6->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZNullMaterial_018c7ba0;
  *(undefined8 *)&pTVar6[1].super_TPZMaterialT<double>.super_TPZMaterial = 0x100000001;
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar6);
  pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fPressureSkeletonMatId);
  if (pTVar5 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x658);
  }
  pTVar6 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)operator_new(0x50);
  iVar1 = this->fPressureSkeletonMatId;
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZSavable_018c8710;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase(pTVar6,&PTR_PTR_018c7c38,iVar1);
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZNullMaterial_018c7a58;
  (pTVar6->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZNullMaterial_018c7ba0;
  *(undefined8 *)&pTVar6[1].super_TPZMaterialT<double>.super_TPZMaterial = 0x100000001;
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar6);
  pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fSecondSkeletonMatId);
  if (pTVar5 == (TPZMaterial *)0x0) {
    pTVar6 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)operator_new(0x50);
    iVar1 = this->fSecondSkeletonMatId;
    *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
         &PTR__TPZSavable_018c8710;
    TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase(pTVar6,&PTR_PTR_018c7c38,iVar1);
    *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
         &PTR__TPZNullMaterial_018c7a58;
    (pTVar6->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
         (TPZMatSingleSpace)&PTR__TPZNullMaterial_018c7ba0;
    *(undefined8 *)&pTVar6[1].super_TPZMaterialT<double>.super_TPZMaterial = 0x100000001;
    TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar6);
    iVar1 = this->fNState;
    iVar2 = ((this->fGMesh).fRef)->fPointer->fDim;
    pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fLagrangeMatIdLeft);
    if (pTVar5 != (TPZMaterial *)0x0) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                 ,0x66b);
    }
    pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fLagrangeMatIdRight);
    if (pTVar5 == (TPZMaterial *)0x0) {
      this_00 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
                 *)operator_new(0x68);
      iVar3 = this->fLagrangeMatIdLeft;
      *(undefined ***)&(this_00->super_TPZMaterialT<double>).super_TPZMaterial =
           &PTR__TPZSavable_018ceda8;
      TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::
      TPZMatBase(this_00,&PTR_PTR_018cdf60,iVar3);
      *(undefined ***)&(this_00->super_TPZMaterialT<double>).super_TPZMaterial =
           &PTR__TPZLagrangeMultiplier_018cdc68;
      (this_00->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
           (TPZMatSingleSpace)&PTR__TPZLagrangeMultiplier_018cddd8;
      this_00->super_TPZMatInterfaceSingleSpace<double> =
           (TPZMatInterfaceSingleSpace<double>)&PTR__TPZLagrangeMultiplier_018cdec8;
      *(undefined **)&this_00[1].super_TPZMaterialT<double>.super_TPZMaterial = &DAT_018cdf50;
      *(int *)&this_00[1].super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber = iVar1;
      *(int *)((long)&this_00[1].super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber + 4) =
           iVar2;
      *(undefined8 *)&this_00[1].super_TPZMaterialT<double>.super_TPZMaterial.fId =
           0x3ff0000000000000;
      this_01 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
                 *)operator_new(0x68);
      iVar3 = this->fLagrangeMatIdRight;
      *(undefined ***)&(this_01->super_TPZMaterialT<double>).super_TPZMaterial =
           &PTR__TPZSavable_018ceda8;
      TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::
      TPZMatBase(this_01,&PTR_PTR_018cdf60,iVar3);
      *(undefined ***)&(this_01->super_TPZMaterialT<double>).super_TPZMaterial =
           &PTR__TPZLagrangeMultiplier_018cdc68;
      (this_01->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
           (TPZMatSingleSpace)&PTR__TPZLagrangeMultiplier_018cddd8;
      this_01->super_TPZMatInterfaceSingleSpace<double> =
           (TPZMatInterfaceSingleSpace<double>)&PTR__TPZLagrangeMultiplier_018cdec8;
      *(undefined **)&this_01[1].super_TPZMaterialT<double>.super_TPZMaterial = &DAT_018cdf50;
      *(int *)&this_01[1].super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber = iVar1;
      *(int *)((long)&this_01[1].super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber + 4) =
           iVar2;
      *(undefined8 *)&this_01[1].super_TPZMaterialT<double>.super_TPZMaterial.fId =
           0x3ff0000000000000;
      pcVar4 = *(code **)(*(long *)&(this_00->super_TPZMaterialT<double>).super_TPZMaterial + 200);
      if (this->fSwitchLagrangeSign == true) {
        (*pcVar4)(0,this_00);
      }
      else {
        (*pcVar4)(0,this_00);
      }
      (**(code **)(*(long *)&(this_01->super_TPZMaterialT<double>).super_TPZMaterial + 200))
                (0,this_01);
      TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)this_00);
      TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)this_01);
      TPZFMatrix<double>::~TPZFMatrix(&local_1a0,&PTR_PTR_01878f38);
      TPZFMatrix<double>::~TPZFMatrix(&local_e8,&PTR_PTR_01878f38);
      return;
    }
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x66e);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
             ,0x65e);
}

Assistant:

void TPZMHMeshControl::InsertPeriferalMaterialObjects()
{
    int matid = *fMaterialIds.begin();
    TPZMaterial *mat = fCMesh->FindMaterial(matid);
    if (!mat) {
        DebugStop();
    }

    TPZFNMatrix<4,STATE> val1(fNState,fNState,0.), val2Flux(fNState,1,0.);
    TPZMaterial *matPerif = nullptr;

    if (fCMesh->FindMaterial(fSkeletonMatId)) {
        DebugStop();
    }
    matPerif = new TPZNullMaterial<STATE>(fSkeletonMatId);
    fCMesh->InsertMaterialObject(matPerif);

    if (1) {
        if (fCMesh->FindMaterial(fPressureSkeletonMatId)) {
            DebugStop();
        }
        matPerif = new TPZNullMaterial<STATE>(fPressureSkeletonMatId);
        fCMesh->InsertMaterialObject(matPerif);

        if (fCMesh->FindMaterial(fSecondSkeletonMatId)) {
            DebugStop();
        }
        matPerif = new TPZNullMaterial<STATE>(fSecondSkeletonMatId);

        fCMesh->InsertMaterialObject(matPerif);


        int LagrangeMatIdLeft = 50;
        int LagrangeMatIdRight = 51;
        int nstate = fNState;
        int dim = fGMesh->Dimension();

        if (fCMesh->FindMaterial(fLagrangeMatIdLeft)) {
            DebugStop();
        }
        if (fCMesh->FindMaterial(fLagrangeMatIdRight)) {
            DebugStop();
        }
        auto *matleft = new TPZLagrangeMultiplier<STATE>(fLagrangeMatIdLeft,dim,nstate);
        auto *matright = new TPZLagrangeMultiplier<STATE>(fLagrangeMatIdRight,dim,nstate);
        if (fSwitchLagrangeSign) {
            matleft->SetMultiplier(-1.);
            matright->SetMultiplier(1.);
        }
        else
        {
            matleft->SetMultiplier(1.);
            matright->SetMultiplier(-1.);
        }
        fCMesh->InsertMaterialObject(matleft);
        fCMesh->InsertMaterialObject(matright);
    }

}